

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

Object * xt::vector::nth(Object *__return_storage_ptr__,Vector *v,uint i,Object *notFound)

{
  Vector local_18;
  
  local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (i < (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cnt) {
    local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    nth(__return_storage_ptr__,&local_18,i);
    if (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_18.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    Object::Object(__return_storage_ptr__,notFound);
  }
  return __return_storage_ptr__;
}

Assistant:

Object nth(Vector v, unsigned int i, Object notFound) {
	if (i < v->cnt) return nth(v, i);
	return notFound;
}